

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

ssize_t sftp_attr2bin(uchar *p,LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  uchar *puStack_28;
  uint32_t flag_mask;
  uchar *s;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  uchar *p_local;
  
  puStack_28 = p;
  s = (uchar *)attrs;
  attrs_local = (LIBSSH2_SFTP_ATTRIBUTES *)p;
  if (attrs == (LIBSSH2_SFTP_ATTRIBUTES *)0x0) {
    _libssh2_htonu32(p,0);
    p_local = (uchar *)0x4;
  }
  else {
    _libssh2_store_u32(&stack0xffffffffffffffd8,(uint)attrs->flags & 0xf);
    if ((*(ulong *)s & 1) != 0) {
      _libssh2_store_u64(&stack0xffffffffffffffd8,*(libssh2_uint64_t *)(s + 8));
    }
    if ((*(ulong *)s & 2) != 0) {
      _libssh2_store_u32(&stack0xffffffffffffffd8,(uint32_t)*(undefined8 *)(s + 0x10));
      _libssh2_store_u32(&stack0xffffffffffffffd8,(uint32_t)*(undefined8 *)(s + 0x18));
    }
    if ((*(ulong *)s & 4) != 0) {
      _libssh2_store_u32(&stack0xffffffffffffffd8,(uint32_t)*(undefined8 *)(s + 0x20));
    }
    if ((*(ulong *)s & 8) != 0) {
      _libssh2_store_u32(&stack0xffffffffffffffd8,(uint32_t)*(undefined8 *)(s + 0x28));
      _libssh2_store_u32(&stack0xffffffffffffffd8,(uint32_t)*(undefined8 *)(s + 0x30));
    }
    p_local = puStack_28 + -(long)attrs_local;
  }
  return (ssize_t)p_local;
}

Assistant:

static ssize_t
sftp_attr2bin(unsigned char *p, const LIBSSH2_SFTP_ATTRIBUTES * attrs)
{
    unsigned char *s = p;
    uint32_t flag_mask =
        LIBSSH2_SFTP_ATTR_SIZE |
        LIBSSH2_SFTP_ATTR_UIDGID |
        LIBSSH2_SFTP_ATTR_PERMISSIONS |
        LIBSSH2_SFTP_ATTR_ACMODTIME;

    /* TODO: When we add SFTP4+ functionality flag_mask can get additional
       bits */

    if(!attrs) {
        _libssh2_htonu32(s, 0);
        return 4;
    }

    _libssh2_store_u32(&s, (uint32_t)(attrs->flags & flag_mask));

    if(attrs->flags & LIBSSH2_SFTP_ATTR_SIZE) {
        _libssh2_store_u64(&s, attrs->filesize);
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_UIDGID) {
        _libssh2_store_u32(&s, (uint32_t)attrs->uid);
        _libssh2_store_u32(&s, (uint32_t)attrs->gid);
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
        _libssh2_store_u32(&s, (uint32_t)attrs->permissions);
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_ACMODTIME) {
        _libssh2_store_u32(&s, (uint32_t)attrs->atime);
        _libssh2_store_u32(&s, (uint32_t)attrs->mtime);
    }

    return s - p;
}